

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

void __thiscall
AlphaVectorPlanning::AlphaVectorPlanning
          (AlphaVectorPlanning *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  PlanningUnitDecPOMDPDiscrete *pPVar1;
  long lVar2;
  long lVar3;
  E *this_00;
  bool bVar4;
  allocator_type local_44;
  allocator_type local_43;
  allocator_type local_42;
  allocator_type local_41 [9];
  vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  *local_38;
  
  TimedAlgorithm::TimedAlgorithm(&this->super_TimedAlgorithm);
  (this->super_TimedAlgorithm)._vptr_TimedAlgorithm =
       (_func_int **)&PTR__AlphaVectorPlanning_005dfd08;
  this->_m_pu = (PlanningUnitDecPOMDPDiscrete *)0x0;
  boost::shared_ptr<const_PlanningUnitDecPOMDPDiscrete>::shared_ptr(&this->_m_puShared,pu);
  (this->_m_Os).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_Os).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_Oe).
  super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_Oe).
  super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_Oe).
  super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_Oes).
  super__Vector_base<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_Oes).
  super__Vector_base<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_Oes).
  super__Vector_base<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_Ts).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_Os).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_Os).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_Os).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_Oe).
  super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_Oe).
  super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_Oe).
  super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_Oes).
  super__Vector_base<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_T).
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_T).
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_T).
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_O).
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_O).
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_O).
  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_Ts).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_Ts).
  super__Vector_base<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ::vector(&this->_m_TsForBackup,0,local_41);
  local_38 = &this->_m_TsForBackup;
  std::
  vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
  ::vector(&this->_m_OsForBackup,0,&local_42);
  std::
  vector<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>,_std::allocator<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>_>_>
  ::vector(&this->_m_eventOsForBackup,0,&local_43);
  std::
  vector<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>,_std::allocator<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>_>_>
  ::vector(&this->_m_TsOsForBackup,0,&local_44);
  pPVar1 = this->_m_pu;
  if (pPVar1 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar1 = (this->_m_puShared).px;
  }
  lVar2 = (**(code **)((long)*(pPVar1->super_PlanningUnitMADPDiscrete)._m_madp + 0x130))();
  if (lVar2 != 0) {
    lVar3 = __dynamic_cast(lVar2,&TransitionModelDiscrete::typeinfo,
                           &TransitionModelMappingSparse::typeinfo,0);
    bVar4 = true;
    if (lVar3 == 0) {
      bVar4 = false;
      lVar2 = __dynamic_cast(lVar2,&TransitionModelDiscrete::typeinfo,
                             &TransitionModelMapping::typeinfo,0);
      if (lVar2 == 0) goto LAB_00413635;
    }
    this->_m_useSparse = bVar4;
    this->_m_initialized = false;
    return;
  }
LAB_00413635:
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "AlphaVectorPlanning::Ctor() TransitionModelDiscretePtr not handled. Use the --cache-flat-models option."
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorPlanning::AlphaVectorPlanning(const boost::shared_ptr<const 
                                         PlanningUnitDecPOMDPDiscrete> &pu) :
    _m_pu(0),
    _m_puShared(pu),
    _m_TsForBackup(0),
    _m_OsForBackup(0),
    _m_eventOsForBackup(0),
    _m_TsOsForBackup(0)
{
    const TransitionModelMappingSparse *tms;
    const TransitionModelMapping *tm;
    const TransitionModelDiscrete *td=GetPU()->GetTransitionModelDiscretePtr();

    if((tms=dynamic_cast<const TransitionModelMappingSparse *>(td)))
        _m_useSparse=true;
    else if((tm=dynamic_cast<const TransitionModelMapping *>(td)))
        _m_useSparse=false;
    else 
        throw(E("AlphaVectorPlanning::Ctor() TransitionModelDiscretePtr not handled. Use the --cache-flat-models option."));

    _m_initialized=false;
}